

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall nuraft::raft_server::handle_reconnect_resp(raft_server *this,resp_msg *resp)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  element_type *peVar5;
  resp_msg *in_RSI;
  long in_RDI;
  char *local_60;
  string local_30 [32];
  resp_msg *local_10;
  
  local_10 = in_RSI;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 0x318));
  if (bVar1) {
    peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2234de);
    iVar2 = (*peVar5->_vptr_logger[7])();
    if (3 < iVar2) {
      peVar5 = std::__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x223501);
      uVar3 = msg_base::get_src(&local_10->super_msg_base);
      uVar4 = msg_base::get_dst(&local_10->super_msg_base);
      bVar1 = resp_msg::get_accepted(local_10);
      if (bVar1) {
        local_60 = "accepted";
      }
      else {
        local_60 = "rejected";
      }
      msg_if_given_abi_cxx11_
                ((char *)local_30,
                 "got re-connection scheduling response from leader %d to my id %d, result %s",
                 (ulong)uVar3,(ulong)uVar4,local_60);
      (*peVar5->_vptr_logger[8])
                (peVar5,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                 ,"handle_reconnect_resp",0x3c0,local_30);
      std::__cxx11::string::~string(local_30);
    }
  }
  return;
}

Assistant:

void raft_server::handle_reconnect_resp(resp_msg& resp) {
    p_in("got re-connection scheduling response "
         "from leader %d to my id %d, result %s",
         resp.get_src(), resp.get_dst(),
         resp.get_accepted() ? "accepted" : "rejected");
}